

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  RTCFilterFunctionN p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  int iVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong *puVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined4 uVar48;
  ulong unaff_R14;
  size_t mask;
  ulong uVar49;
  bool bVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined4 uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_16e1;
  undefined1 local_16e0 [16];
  long local_16c8;
  undefined1 local_16c0 [16];
  undefined1 local_16b0 [16];
  undefined1 local_16a0 [16];
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined8 local_1670;
  float fStack_1668;
  float fStack_1664;
  ulong local_1658;
  ulong local_1650;
  ulong local_1648;
  undefined1 local_1640 [16];
  ulong local_1628;
  ulong local_1620;
  ulong *local_1618;
  RTCFilterFunctionNArguments local_1610;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined1 local_15b0 [16];
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  float local_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined1 *local_1520;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  int local_1480;
  int iStack_147c;
  int iStack_1478;
  int iStack_1474;
  int iStack_1470;
  int iStack_146c;
  int iStack_1468;
  int iStack_1464;
  int local_1460;
  int iStack_145c;
  int iStack_1458;
  int iStack_1454;
  int iStack_1450;
  int iStack_144c;
  int iStack_1448;
  int iStack_1444;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined1 local_13c0 [8];
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined4 local_1380;
  undefined4 uStack_137c;
  undefined4 uStack_1378;
  undefined4 uStack_1374;
  undefined4 uStack_1370;
  undefined4 uStack_136c;
  undefined4 uStack_1368;
  undefined4 uStack_1364;
  undefined4 local_1360;
  undefined4 uStack_135c;
  undefined4 uStack_1358;
  undefined4 uStack_1354;
  undefined4 uStack_1350;
  undefined4 uStack_134c;
  undefined4 uStack_1348;
  undefined4 uStack_1344;
  undefined4 local_1340;
  undefined4 uStack_133c;
  undefined4 uStack_1338;
  undefined4 uStack_1334;
  undefined4 uStack_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  local_1340 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  uStack_133c = local_1340;
  uStack_1338 = local_1340;
  uStack_1334 = local_1340;
  uStack_1330 = local_1340;
  uStack_132c = local_1340;
  uStack_1328 = local_1340;
  uStack_1324 = local_1340;
  local_1360 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uStack_135c = local_1360;
  uStack_1358 = local_1360;
  uStack_1354 = local_1360;
  uStack_1350 = local_1360;
  uStack_134c = local_1360;
  uStack_1348 = local_1360;
  uStack_1344 = local_1360;
  local_1380 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uStack_137c = local_1380;
  uStack_1378 = local_1380;
  uStack_1374 = local_1380;
  uStack_1370 = local_1380;
  uStack_136c = local_1380;
  uStack_1368 = local_1380;
  uStack_1364 = local_1380;
  local_1400 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1420 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1440 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_13a0 = local_1400 * 0.99999964;
  fStack_139c = local_13a0;
  fStack_1398 = local_13a0;
  fStack_1394 = local_13a0;
  fStack_1390 = local_13a0;
  fStack_138c = local_13a0;
  fStack_1388 = local_13a0;
  fStack_1384 = local_13a0;
  fVar14 = local_1420 * 0.99999964;
  local_13c0._4_4_ = fVar14;
  local_13c0._0_4_ = fVar14;
  fStack_13b8 = fVar14;
  fStack_13b4 = fVar14;
  fStack_13b0 = fVar14;
  fStack_13ac = fVar14;
  fStack_13a8 = fVar14;
  register0x0000131c = fVar14;
  local_13e0 = local_1440 * 0.99999964;
  fStack_13dc = local_13e0;
  fStack_13d8 = local_13e0;
  fStack_13d4 = local_13e0;
  fStack_13d0 = local_13e0;
  fStack_13cc = local_13e0;
  fStack_13c8 = local_13e0;
  fStack_13c4 = local_13e0;
  local_1400 = local_1400 * 1.0000004;
  fStack_13fc = local_1400;
  fStack_13f8 = local_1400;
  fStack_13f4 = local_1400;
  fStack_13f0 = local_1400;
  fStack_13ec = local_1400;
  fStack_13e8 = local_1400;
  fStack_13e4 = local_1400;
  local_1420 = local_1420 * 1.0000004;
  fStack_141c = local_1420;
  fStack_1418 = local_1420;
  fStack_1414 = local_1420;
  fStack_1410 = local_1420;
  fStack_140c = local_1420;
  fStack_1408 = local_1420;
  fStack_1404 = local_1420;
  local_1440 = local_1440 * 1.0000004;
  fStack_143c = local_1440;
  fStack_1438 = local_1440;
  fStack_1434 = local_1440;
  fStack_1430 = local_1440;
  fStack_142c = local_1440;
  fStack_1428 = local_1440;
  fStack_1424 = local_1440;
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar49 = uVar44 ^ 0x20;
  uVar46 = uVar45 ^ 0x20;
  local_1460 = (tray->tnear).field_0.i[k];
  iStack_145c = local_1460;
  iStack_1458 = local_1460;
  iStack_1454 = local_1460;
  iStack_1450 = local_1460;
  iStack_144c = local_1460;
  iStack_1448 = local_1460;
  iStack_1444 = local_1460;
  local_1480 = (tray->tfar).field_0.i[k];
  iStack_147c = local_1480;
  iStack_1478 = local_1480;
  iStack_1474 = local_1480;
  iStack_1470 = local_1480;
  iStack_146c = local_1480;
  iStack_1468 = local_1480;
  iStack_1464 = local_1480;
  uVar47 = uVar40 ^ 0x20;
  iVar36 = 1 << ((uint)k & 0x1f);
  auVar58._4_4_ = iVar36;
  auVar58._0_4_ = iVar36;
  auVar58._8_4_ = iVar36;
  auVar58._12_4_ = iVar36;
  auVar58._16_4_ = iVar36;
  auVar58._20_4_ = iVar36;
  auVar58._24_4_ = iVar36;
  auVar58._28_4_ = iVar36;
  auVar16 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar58 = vpand_avx2(auVar58,auVar16);
  local_14a0 = vpcmpeqd_avx2(auVar58,auVar16);
  puVar43 = local_11f8;
  local_1658 = uVar47;
  local_1650 = uVar46;
  local_1648 = uVar49;
  do {
    local_1618 = puVar43;
    if (local_1618 == &local_1200) break;
    puVar43 = local_1618 + -1;
    uVar42 = local_1618[-1];
    do {
      if ((uVar42 & 8) == 0) {
        auVar35._4_4_ = uStack_133c;
        auVar35._0_4_ = local_1340;
        auVar35._8_4_ = uStack_1338;
        auVar35._12_4_ = uStack_1334;
        auVar35._16_4_ = uStack_1330;
        auVar35._20_4_ = uStack_132c;
        auVar35._24_4_ = uStack_1328;
        auVar35._28_4_ = uStack_1324;
        auVar58 = vsubps_avx(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar44),auVar35);
        auVar16._4_4_ = auVar58._4_4_ * fStack_139c;
        auVar16._0_4_ = auVar58._0_4_ * local_13a0;
        auVar16._8_4_ = auVar58._8_4_ * fStack_1398;
        auVar16._12_4_ = auVar58._12_4_ * fStack_1394;
        auVar16._16_4_ = auVar58._16_4_ * fStack_1390;
        auVar16._20_4_ = auVar58._20_4_ * fStack_138c;
        auVar16._24_4_ = auVar58._24_4_ * fStack_1388;
        auVar16._28_4_ = auVar58._28_4_;
        auVar34._4_4_ = uStack_135c;
        auVar34._0_4_ = local_1360;
        auVar34._8_4_ = uStack_1358;
        auVar34._12_4_ = uStack_1354;
        auVar34._16_4_ = uStack_1350;
        auVar34._20_4_ = uStack_134c;
        auVar34._24_4_ = uStack_1348;
        auVar34._28_4_ = uStack_1344;
        auVar58 = vsubps_avx(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar45),auVar34);
        auVar15._4_4_ = auVar58._4_4_ * (float)local_13c0._4_4_;
        auVar15._0_4_ = auVar58._0_4_ * (float)local_13c0._0_4_;
        auVar15._8_4_ = auVar58._8_4_ * fStack_13b8;
        auVar15._12_4_ = auVar58._12_4_ * fStack_13b4;
        auVar15._16_4_ = auVar58._16_4_ * fStack_13b0;
        auVar15._20_4_ = auVar58._20_4_ * fStack_13ac;
        auVar15._24_4_ = auVar58._24_4_ * fStack_13a8;
        auVar15._28_4_ = auVar58._28_4_;
        auVar58 = vmaxps_avx(auVar16,auVar15);
        auVar33._4_4_ = uStack_137c;
        auVar33._0_4_ = local_1380;
        auVar33._8_4_ = uStack_1378;
        auVar33._12_4_ = uStack_1374;
        auVar33._16_4_ = uStack_1370;
        auVar33._20_4_ = uStack_136c;
        auVar33._24_4_ = uStack_1368;
        auVar33._28_4_ = uStack_1364;
        auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar40),auVar33);
        auVar17._4_4_ = auVar16._4_4_ * fStack_13dc;
        auVar17._0_4_ = auVar16._0_4_ * local_13e0;
        auVar17._8_4_ = auVar16._8_4_ * fStack_13d8;
        auVar17._12_4_ = auVar16._12_4_ * fStack_13d4;
        auVar17._16_4_ = auVar16._16_4_ * fStack_13d0;
        auVar17._20_4_ = auVar16._20_4_ * fStack_13cc;
        auVar17._24_4_ = auVar16._24_4_ * fStack_13c8;
        auVar17._28_4_ = auVar16._28_4_;
        auVar32._4_4_ = iStack_145c;
        auVar32._0_4_ = local_1460;
        auVar32._8_4_ = iStack_1458;
        auVar32._12_4_ = iStack_1454;
        auVar32._16_4_ = iStack_1450;
        auVar32._20_4_ = iStack_144c;
        auVar32._24_4_ = iStack_1448;
        auVar32._28_4_ = iStack_1444;
        auVar16 = vmaxps_avx(auVar17,auVar32);
        auVar58 = vmaxps_avx(auVar58,auVar16);
        auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar49),auVar35);
        auVar18._4_4_ = auVar16._4_4_ * fStack_13fc;
        auVar18._0_4_ = auVar16._0_4_ * local_1400;
        auVar18._8_4_ = auVar16._8_4_ * fStack_13f8;
        auVar18._12_4_ = auVar16._12_4_ * fStack_13f4;
        auVar18._16_4_ = auVar16._16_4_ * fStack_13f0;
        auVar18._20_4_ = auVar16._20_4_ * fStack_13ec;
        auVar18._24_4_ = auVar16._24_4_ * fStack_13e8;
        auVar18._28_4_ = auVar16._28_4_;
        auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar46),auVar34);
        auVar19._4_4_ = auVar16._4_4_ * fStack_141c;
        auVar19._0_4_ = auVar16._0_4_ * local_1420;
        auVar19._8_4_ = auVar16._8_4_ * fStack_1418;
        auVar19._12_4_ = auVar16._12_4_ * fStack_1414;
        auVar19._16_4_ = auVar16._16_4_ * fStack_1410;
        auVar19._20_4_ = auVar16._20_4_ * fStack_140c;
        auVar19._24_4_ = auVar16._24_4_ * fStack_1408;
        auVar19._28_4_ = auVar16._28_4_;
        auVar16 = vminps_avx(auVar18,auVar19);
        auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar47),auVar33);
        auVar20._4_4_ = auVar15._4_4_ * fStack_143c;
        auVar20._0_4_ = auVar15._0_4_ * local_1440;
        auVar20._8_4_ = auVar15._8_4_ * fStack_1438;
        auVar20._12_4_ = auVar15._12_4_ * fStack_1434;
        auVar20._16_4_ = auVar15._16_4_ * fStack_1430;
        auVar20._20_4_ = auVar15._20_4_ * fStack_142c;
        auVar20._24_4_ = auVar15._24_4_ * fStack_1428;
        auVar20._28_4_ = auVar15._28_4_;
        auVar31._4_4_ = iStack_147c;
        auVar31._0_4_ = local_1480;
        auVar31._8_4_ = iStack_1478;
        auVar31._12_4_ = iStack_1474;
        auVar31._16_4_ = iStack_1470;
        auVar31._20_4_ = iStack_146c;
        auVar31._24_4_ = iStack_1468;
        auVar31._28_4_ = iStack_1464;
        auVar15 = vminps_avx(auVar20,auVar31);
        auVar16 = vminps_avx(auVar16,auVar15);
        auVar58 = vcmpps_avx(auVar58,auVar16,2);
        uVar48 = vmovmskps_avx(auVar58);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar48);
      }
      if ((uVar42 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar37 = 4;
        }
        else {
          uVar41 = uVar42 & 0xfffffffffffffff0;
          lVar39 = 0;
          for (uVar42 = unaff_R14; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
            lVar39 = lVar39 + 1;
          }
          for (uVar38 = unaff_R14 - 1 & unaff_R14; uVar42 = *(ulong *)(uVar41 + lVar39 * 8),
              uVar38 != 0; uVar38 = uVar38 - 1 & uVar38) {
            *puVar43 = uVar42;
            puVar43 = puVar43 + 1;
            lVar39 = 0;
            for (uVar42 = uVar38; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
          }
          uVar37 = 0;
        }
      }
      else {
        uVar37 = 6;
      }
    } while (uVar37 == 0);
    if (uVar37 == 6) {
      uVar37 = 0;
      local_1620 = (ulong)((uint)uVar42 & 0xf) - 8;
      bVar50 = local_1620 != 0;
      if (bVar50) {
        uVar42 = uVar42 & 0xfffffffffffffff0;
        local_1628 = 0;
        do {
          local_16c8 = local_1628 * 0xb0;
          uVar48 = *(undefined4 *)(ray + k * 4);
          auVar52._4_4_ = uVar48;
          auVar52._0_4_ = uVar48;
          auVar52._8_4_ = uVar48;
          auVar52._12_4_ = uVar48;
          uVar48 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar65._4_4_ = uVar48;
          auVar65._0_4_ = uVar48;
          auVar65._8_4_ = uVar48;
          auVar65._12_4_ = uVar48;
          uVar48 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar69._4_4_ = uVar48;
          auVar69._0_4_ = uVar48;
          auVar69._8_4_ = uVar48;
          auVar69._12_4_ = uVar48;
          local_1680 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + local_16c8),auVar52);
          local_1690 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x10 + local_16c8),auVar65);
          local_16a0 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + local_16c8),auVar69);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x30 + local_16c8),auVar52);
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x40 + local_16c8),auVar65);
          auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x50 + local_16c8),auVar69);
          auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x60 + local_16c8),auVar52);
          auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x70 + local_16c8),auVar65);
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x80 + local_16c8),auVar69);
          local_16b0 = vsubps_avx(auVar52,local_1680);
          local_1560 = vsubps_avx(auVar65,local_1690);
          local_1640 = vsubps_avx(auVar69,local_16a0);
          auVar53._0_4_ = local_1680._0_4_ + auVar52._0_4_;
          auVar53._4_4_ = local_1680._4_4_ + auVar52._4_4_;
          auVar53._8_4_ = local_1680._8_4_ + auVar52._8_4_;
          auVar53._12_4_ = local_1680._12_4_ + auVar52._12_4_;
          auVar70._0_4_ = local_1690._0_4_ + auVar65._0_4_;
          auVar70._4_4_ = local_1690._4_4_ + auVar65._4_4_;
          auVar70._8_4_ = local_1690._8_4_ + auVar65._8_4_;
          auVar70._12_4_ = local_1690._12_4_ + auVar65._12_4_;
          fVar99 = local_16a0._0_4_;
          auVar72._0_4_ = fVar99 + auVar69._0_4_;
          fVar100 = local_16a0._4_4_;
          auVar72._4_4_ = fVar100 + auVar69._4_4_;
          fVar101 = local_16a0._8_4_;
          auVar72._8_4_ = fVar101 + auVar69._8_4_;
          fVar102 = local_16a0._12_4_;
          auVar72._12_4_ = fVar102 + auVar69._12_4_;
          auVar97._0_4_ = local_1640._0_4_ * auVar70._0_4_;
          auVar97._4_4_ = local_1640._4_4_ * auVar70._4_4_;
          auVar97._8_4_ = local_1640._8_4_ * auVar70._8_4_;
          auVar97._12_4_ = local_1640._12_4_ * auVar70._12_4_;
          auVar55 = vfmsub231ps_fma(auVar97,local_1560,auVar72);
          auVar73._0_4_ = auVar72._0_4_ * local_16b0._0_4_;
          auVar73._4_4_ = auVar72._4_4_ * local_16b0._4_4_;
          auVar73._8_4_ = auVar72._8_4_ * local_16b0._8_4_;
          auVar73._12_4_ = auVar72._12_4_ * local_16b0._12_4_;
          auVar72 = vfmsub231ps_fma(auVar73,local_1640,auVar53);
          auVar54._0_4_ = local_1560._0_4_ * auVar53._0_4_;
          auVar54._4_4_ = local_1560._4_4_ * auVar53._4_4_;
          auVar54._8_4_ = local_1560._8_4_ * auVar53._8_4_;
          auVar54._12_4_ = local_1560._12_4_ * auVar53._12_4_;
          auVar53 = vfmsub231ps_fma(auVar54,local_16b0,auVar70);
          local_1670._4_4_ = *(float *)(ray + k * 4 + 0xc0);
          auVar66._0_4_ = local_1670._4_4_ * auVar53._0_4_;
          auVar66._4_4_ = local_1670._4_4_ * auVar53._4_4_;
          auVar66._8_4_ = local_1670._4_4_ * auVar53._8_4_;
          auVar66._12_4_ = local_1670._4_4_ * auVar53._12_4_;
          uVar48 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar94._4_4_ = uVar48;
          auVar94._0_4_ = uVar48;
          auVar94._8_4_ = uVar48;
          auVar94._12_4_ = uVar48;
          auVar72 = vfmadd231ps_fma(auVar66,auVar94,auVar72);
          uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_16c0._4_4_ = uVar48;
          local_16c0._0_4_ = uVar48;
          local_16c0._8_4_ = uVar48;
          local_16c0._12_4_ = uVar48;
          local_15a0 = vfmadd231ps_fma(auVar72,local_16c0,auVar55);
          local_1570 = vsubps_avx(local_1690,auVar79);
          local_1580 = vsubps_avx(local_16a0,auVar60);
          auVar78._0_4_ = auVar79._0_4_ + local_1690._0_4_;
          auVar78._4_4_ = auVar79._4_4_ + local_1690._4_4_;
          auVar78._8_4_ = auVar79._8_4_ + local_1690._8_4_;
          auVar78._12_4_ = auVar79._12_4_ + local_1690._12_4_;
          auVar74._0_4_ = fVar99 + auVar60._0_4_;
          auVar74._4_4_ = fVar100 + auVar60._4_4_;
          auVar74._8_4_ = fVar101 + auVar60._8_4_;
          auVar74._12_4_ = fVar102 + auVar60._12_4_;
          fVar14 = local_1580._0_4_;
          auVar83._0_4_ = auVar78._0_4_ * fVar14;
          fVar5 = local_1580._4_4_;
          auVar83._4_4_ = auVar78._4_4_ * fVar5;
          fVar8 = local_1580._8_4_;
          auVar83._8_4_ = auVar78._8_4_ * fVar8;
          fVar11 = local_1580._12_4_;
          auVar83._12_4_ = auVar78._12_4_ * fVar11;
          auVar55 = vfmsub231ps_fma(auVar83,local_1570,auVar74);
          local_1590 = vsubps_avx(local_1680,auVar59);
          fVar3 = local_1590._0_4_;
          auVar90._0_4_ = auVar74._0_4_ * fVar3;
          fVar6 = local_1590._4_4_;
          auVar90._4_4_ = auVar74._4_4_ * fVar6;
          fVar9 = local_1590._8_4_;
          auVar90._8_4_ = auVar74._8_4_ * fVar9;
          fVar12 = local_1590._12_4_;
          auVar90._12_4_ = auVar74._12_4_ * fVar12;
          auVar75._0_4_ = local_1680._0_4_ + auVar59._0_4_;
          auVar75._4_4_ = local_1680._4_4_ + auVar59._4_4_;
          auVar75._8_4_ = local_1680._8_4_ + auVar59._8_4_;
          auVar75._12_4_ = local_1680._12_4_ + auVar59._12_4_;
          auVar72 = vfmsub231ps_fma(auVar90,local_1580,auVar75);
          fVar4 = local_1570._0_4_;
          auVar76._0_4_ = auVar75._0_4_ * fVar4;
          fVar7 = local_1570._4_4_;
          auVar76._4_4_ = auVar75._4_4_ * fVar7;
          fVar10 = local_1570._8_4_;
          auVar76._8_4_ = auVar75._8_4_ * fVar10;
          fVar13 = local_1570._12_4_;
          auVar76._12_4_ = auVar75._12_4_ * fVar13;
          auVar53 = vfmsub231ps_fma(auVar76,local_1590,auVar78);
          auVar77._0_4_ = local_1670._4_4_ * auVar53._0_4_;
          auVar77._4_4_ = local_1670._4_4_ * auVar53._4_4_;
          auVar77._8_4_ = local_1670._4_4_ * auVar53._8_4_;
          auVar77._12_4_ = local_1670._4_4_ * auVar53._12_4_;
          auVar72 = vfmadd231ps_fma(auVar77,auVar94,auVar72);
          local_1540 = vfmadd231ps_fma(auVar72,local_16c0,auVar55);
          auVar72 = vsubps_avx(auVar59,auVar52);
          auVar84._0_4_ = auVar59._0_4_ + auVar52._0_4_;
          auVar84._4_4_ = auVar59._4_4_ + auVar52._4_4_;
          auVar84._8_4_ = auVar59._8_4_ + auVar52._8_4_;
          auVar84._12_4_ = auVar59._12_4_ + auVar52._12_4_;
          auVar52 = vsubps_avx(auVar79,auVar65);
          auVar55._0_4_ = auVar79._0_4_ + auVar65._0_4_;
          auVar55._4_4_ = auVar79._4_4_ + auVar65._4_4_;
          auVar55._8_4_ = auVar79._8_4_ + auVar65._8_4_;
          auVar55._12_4_ = auVar79._12_4_ + auVar65._12_4_;
          auVar65 = vsubps_avx(auVar60,auVar69);
          auVar59._0_4_ = auVar60._0_4_ + auVar69._0_4_;
          auVar59._4_4_ = auVar60._4_4_ + auVar69._4_4_;
          auVar59._8_4_ = auVar60._8_4_ + auVar69._8_4_;
          auVar59._12_4_ = auVar60._12_4_ + auVar69._12_4_;
          auVar79._0_4_ = auVar65._0_4_ * auVar55._0_4_;
          auVar79._4_4_ = auVar65._4_4_ * auVar55._4_4_;
          auVar79._8_4_ = auVar65._8_4_ * auVar55._8_4_;
          auVar79._12_4_ = auVar65._12_4_ * auVar55._12_4_;
          auVar79 = vfmsub231ps_fma(auVar79,auVar52,auVar59);
          auVar60._0_4_ = auVar59._0_4_ * auVar72._0_4_;
          auVar60._4_4_ = auVar59._4_4_ * auVar72._4_4_;
          auVar60._8_4_ = auVar59._8_4_ * auVar72._8_4_;
          auVar60._12_4_ = auVar59._12_4_ * auVar72._12_4_;
          auVar59 = vfmsub231ps_fma(auVar60,auVar65,auVar84);
          auVar85._0_4_ = auVar52._0_4_ * auVar84._0_4_;
          auVar85._4_4_ = auVar52._4_4_ * auVar84._4_4_;
          auVar85._8_4_ = auVar52._8_4_ * auVar84._8_4_;
          auVar85._12_4_ = auVar52._12_4_ * auVar84._12_4_;
          auVar60 = vfmsub231ps_fma(auVar85,auVar72,auVar55);
          local_1670._0_4_ = local_1670._4_4_;
          fStack_1668 = local_1670._4_4_;
          fStack_1664 = local_1670._4_4_;
          auVar86._0_4_ = local_1670._4_4_ * auVar60._0_4_;
          auVar86._4_4_ = local_1670._4_4_ * auVar60._4_4_;
          auVar86._8_4_ = local_1670._4_4_ * auVar60._8_4_;
          auVar86._12_4_ = local_1670._4_4_ * auVar60._12_4_;
          auVar59 = vfmadd231ps_fma(auVar86,auVar94,auVar59);
          auVar60 = vfmadd231ps_fma(auVar59,local_16c0,auVar79);
          local_1550 = local_15a0._0_4_;
          fStack_154c = local_15a0._4_4_;
          fStack_1548 = local_15a0._8_4_;
          fStack_1544 = local_15a0._12_4_;
          local_1530._0_4_ = auVar60._0_4_ + local_1540._0_4_ + local_1550;
          local_1530._4_4_ = auVar60._4_4_ + local_1540._4_4_ + fStack_154c;
          local_1530._8_4_ = auVar60._8_4_ + local_1540._8_4_ + fStack_1548;
          local_1530._12_4_ = auVar60._12_4_ + local_1540._12_4_ + fStack_1544;
          auVar98._8_4_ = 0x7fffffff;
          auVar98._0_8_ = 0x7fffffff7fffffff;
          auVar98._12_4_ = 0x7fffffff;
          auVar59 = vminps_avx(local_15a0,local_1540);
          auVar59 = vminps_avx(auVar59,auVar60);
          local_15b0 = vandps_avx(local_1530,auVar98);
          auVar91._0_4_ = local_15b0._0_4_ * 1.1920929e-07;
          auVar91._4_4_ = local_15b0._4_4_ * 1.1920929e-07;
          auVar91._8_4_ = local_15b0._8_4_ * 1.1920929e-07;
          auVar91._12_4_ = local_15b0._12_4_ * 1.1920929e-07;
          uVar46 = CONCAT44(auVar91._4_4_,auVar91._0_4_);
          auVar80._0_8_ = uVar46 ^ 0x8000000080000000;
          auVar80._8_4_ = -auVar91._8_4_;
          auVar80._12_4_ = -auVar91._12_4_;
          auVar59 = vcmpps_avx(auVar59,auVar80,5);
          auVar79 = vmaxps_avx(local_15a0,local_1540);
          auVar79 = vmaxps_avx(auVar79,auVar60);
          auVar79 = vcmpps_avx(auVar79,auVar91,2);
          local_16e0 = vorps_avx(auVar59,auVar79);
          if ((((local_16e0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_16e0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_16e0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_16e0[0xf] < '\0') {
            auVar81._0_4_ = fVar4 * local_1640._0_4_;
            auVar81._4_4_ = fVar7 * local_1640._4_4_;
            auVar81._8_4_ = fVar10 * local_1640._8_4_;
            auVar81._12_4_ = fVar13 * local_1640._12_4_;
            auVar87._0_4_ = fVar3 * local_1560._0_4_;
            auVar87._4_4_ = fVar6 * local_1560._4_4_;
            auVar87._8_4_ = fVar9 * local_1560._8_4_;
            auVar87._12_4_ = fVar12 * local_1560._12_4_;
            auVar60 = vfmsub213ps_fma(local_1560,local_1580,auVar81);
            auVar92._0_4_ = auVar52._0_4_ * fVar14;
            auVar92._4_4_ = auVar52._4_4_ * fVar5;
            auVar92._8_4_ = auVar52._8_4_ * fVar8;
            auVar92._12_4_ = auVar52._12_4_ * fVar11;
            auVar61._0_4_ = fVar3 * auVar65._0_4_;
            auVar61._4_4_ = fVar6 * auVar65._4_4_;
            auVar61._8_4_ = fVar9 * auVar65._8_4_;
            auVar61._12_4_ = fVar12 * auVar65._12_4_;
            auVar65 = vfmsub213ps_fma(auVar65,local_1570,auVar92);
            auVar59 = vandps_avx(auVar98,auVar81);
            auVar79 = vandps_avx(auVar98,auVar92);
            auVar59 = vcmpps_avx(auVar59,auVar79,1);
            local_14d0 = vblendvps_avx(auVar65,auVar60,auVar59);
            auVar82._0_4_ = fVar4 * auVar72._0_4_;
            auVar82._4_4_ = fVar7 * auVar72._4_4_;
            auVar82._8_4_ = fVar10 * auVar72._8_4_;
            auVar82._12_4_ = fVar13 * auVar72._12_4_;
            auVar60 = vfmsub213ps_fma(auVar72,local_1580,auVar61);
            auVar95._0_4_ = local_16b0._0_4_ * fVar14;
            auVar95._4_4_ = local_16b0._4_4_ * fVar5;
            auVar95._8_4_ = local_16b0._8_4_ * fVar8;
            auVar95._12_4_ = local_16b0._12_4_ * fVar11;
            auVar65 = vfmsub213ps_fma(local_1640,local_1590,auVar95);
            auVar59 = vandps_avx(auVar95,auVar98);
            auVar79 = vandps_avx(auVar98,auVar61);
            auVar59 = vcmpps_avx(auVar59,auVar79,1);
            local_14c0 = vblendvps_avx(auVar60,auVar65,auVar59);
            auVar60 = vfmsub213ps_fma(local_16b0,local_1570,auVar87);
            auVar52 = vfmsub213ps_fma(auVar52,local_1590,auVar82);
            auVar59 = vandps_avx(auVar98,auVar87);
            auVar79 = vandps_avx(auVar98,auVar82);
            auVar59 = vcmpps_avx(auVar59,auVar79,1);
            local_14b0 = vblendvps_avx(auVar52,auVar60,auVar59);
            auVar62._0_4_ = local_14b0._0_4_ * local_1670._4_4_;
            auVar62._4_4_ = local_14b0._4_4_ * local_1670._4_4_;
            auVar62._8_4_ = local_14b0._8_4_ * local_1670._4_4_;
            auVar62._12_4_ = local_14b0._12_4_ * local_1670._4_4_;
            auVar59 = vfmadd213ps_fma(auVar94,local_14c0,auVar62);
            auVar59 = vfmadd213ps_fma(local_16c0,local_14d0,auVar59);
            auVar88._0_4_ = auVar59._0_4_ + auVar59._0_4_;
            auVar88._4_4_ = auVar59._4_4_ + auVar59._4_4_;
            auVar88._8_4_ = auVar59._8_4_ + auVar59._8_4_;
            auVar88._12_4_ = auVar59._12_4_ + auVar59._12_4_;
            auVar63._0_4_ = local_14b0._0_4_ * fVar99;
            auVar63._4_4_ = local_14b0._4_4_ * fVar100;
            auVar63._8_4_ = local_14b0._8_4_ * fVar101;
            auVar63._12_4_ = local_14b0._12_4_ * fVar102;
            auVar59 = vfmadd213ps_fma(local_1690,local_14c0,auVar63);
            auVar79 = vfmadd213ps_fma(local_1680,local_14d0,auVar59);
            auVar59 = vrcpps_avx(auVar88);
            auVar96._8_4_ = 0x3f800000;
            auVar96._0_8_ = &DAT_3f8000003f800000;
            auVar96._12_4_ = 0x3f800000;
            auVar60 = vfnmadd213ps_fma(auVar59,auVar88,auVar96);
            auVar59 = vfmadd132ps_fma(auVar60,auVar59,auVar59);
            local_14e0._0_4_ = auVar59._0_4_ * (auVar79._0_4_ + auVar79._0_4_);
            local_14e0._4_4_ = auVar59._4_4_ * (auVar79._4_4_ + auVar79._4_4_);
            local_14e0._8_4_ = auVar59._8_4_ * (auVar79._8_4_ + auVar79._8_4_);
            local_14e0._12_4_ = auVar59._12_4_ * (auVar79._12_4_ + auVar79._12_4_);
            uVar48 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar64._4_4_ = uVar48;
            auVar64._0_4_ = uVar48;
            auVar64._8_4_ = uVar48;
            auVar64._12_4_ = uVar48;
            auVar59 = vcmpps_avx(auVar64,local_14e0,2);
            uVar48 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar93._4_4_ = uVar48;
            auVar93._0_4_ = uVar48;
            auVar93._8_4_ = uVar48;
            auVar93._12_4_ = uVar48;
            auVar79 = vcmpps_avx(local_14e0,auVar93,2);
            auVar59 = vandps_avx(auVar79,auVar59);
            auVar79 = local_16e0 & auVar59;
            if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar79[0xf] < '\0') {
              auVar59 = vandps_avx(auVar59,local_16e0);
              auVar79 = vcmpps_avx(auVar88,_DAT_01feba10,4);
              auVar60 = auVar79 & auVar59;
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar60[0xf] < '\0') {
                local_16c8 = local_16c8 + uVar42;
                local_1510 = vandps_avx(auVar59,auVar79);
                local_1520 = &local_16e1;
                local_1670 = (long)context->scene;
                auVar59 = vrcpps_avx(local_1530);
                auVar71._8_4_ = 0x3f800000;
                auVar71._0_8_ = &DAT_3f8000003f800000;
                auVar71._12_4_ = 0x3f800000;
                auVar79 = vfnmadd213ps_fma(local_1530,auVar59,auVar71);
                auVar79 = vfmadd132ps_fma(auVar79,auVar59,auVar59);
                auVar67._8_4_ = 0x219392ef;
                auVar67._0_8_ = 0x219392ef219392ef;
                auVar67._12_4_ = 0x219392ef;
                auVar59 = vcmpps_avx(local_15b0,auVar67,5);
                auVar59 = vandps_avx(auVar79,auVar59);
                auVar56._0_4_ = local_1550 * auVar59._0_4_;
                auVar56._4_4_ = fStack_154c * auVar59._4_4_;
                auVar56._8_4_ = fStack_1548 * auVar59._8_4_;
                auVar56._12_4_ = fStack_1544 * auVar59._12_4_;
                local_1500 = vminps_avx(auVar56,auVar71);
                auVar57._0_4_ = auVar59._0_4_ * local_1540._0_4_;
                auVar57._4_4_ = auVar59._4_4_ * local_1540._4_4_;
                auVar57._8_4_ = auVar59._8_4_ * local_1540._8_4_;
                auVar57._12_4_ = auVar59._12_4_ * local_1540._12_4_;
                local_14f0 = vminps_avx(auVar57,auVar71);
                uVar48 = vmovmskps_avx(local_1510);
                uVar47 = CONCAT44((int)(uVar47 >> 0x20),uVar48);
                do {
                  uVar46 = 0;
                  for (uVar49 = uVar47; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000
                      ) {
                    uVar46 = uVar46 + 1;
                  }
                  uVar37 = *(uint *)(local_16c8 + 0x90 + uVar46 * 4);
                  lVar39 = *(long *)(*(long *)(local_1670 + 0x1e8) + (ulong)uVar37 * 8);
                  if ((*(uint *)(lVar39 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    uVar47 = uVar47 ^ 1L << (uVar46 & 0x3f);
                    bVar51 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (*(long *)(lVar39 + 0x48) == 0)) {
                    bVar51 = false;
                  }
                  else {
                    local_16c0._0_8_ = uVar40;
                    uVar40 = (ulong)(uint)((int)uVar46 * 4);
                    uVar89 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_12c0 = *(undefined4 *)(local_1500 + uVar40);
                    uVar48 = *(undefined4 *)(local_14f0 + uVar40);
                    local_12a0._4_4_ = uVar48;
                    local_12a0._0_4_ = uVar48;
                    local_12a0._8_4_ = uVar48;
                    local_12a0._12_4_ = uVar48;
                    local_12a0._16_4_ = uVar48;
                    local_12a0._20_4_ = uVar48;
                    local_12a0._24_4_ = uVar48;
                    local_12a0._28_4_ = uVar48;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_14e0 + uVar40);
                    local_1610.context = context->user;
                    uVar48 = *(undefined4 *)(local_16c8 + 0xa0 + uVar40);
                    local_1280._4_4_ = uVar48;
                    local_1280._0_4_ = uVar48;
                    local_1280._8_4_ = uVar48;
                    local_1280._12_4_ = uVar48;
                    local_1280._16_4_ = uVar48;
                    local_1280._20_4_ = uVar48;
                    local_1280._24_4_ = uVar48;
                    local_1280._28_4_ = uVar48;
                    uVar48 = *(undefined4 *)(local_14d0 + uVar40);
                    uVar1 = *(undefined4 *)(local_14c0 + uVar40);
                    local_1300._4_4_ = uVar1;
                    local_1300._0_4_ = uVar1;
                    local_1300._8_4_ = uVar1;
                    local_1300._12_4_ = uVar1;
                    local_1300._16_4_ = uVar1;
                    local_1300._20_4_ = uVar1;
                    local_1300._24_4_ = uVar1;
                    local_1300._28_4_ = uVar1;
                    uVar1 = *(undefined4 *)(local_14b0 + uVar40);
                    local_12e0._4_4_ = uVar1;
                    local_12e0._0_4_ = uVar1;
                    local_12e0._8_4_ = uVar1;
                    local_12e0._12_4_ = uVar1;
                    local_12e0._16_4_ = uVar1;
                    local_12e0._20_4_ = uVar1;
                    local_12e0._24_4_ = uVar1;
                    local_12e0._28_4_ = uVar1;
                    local_1260._4_4_ = uVar37;
                    local_1260._0_4_ = uVar37;
                    local_1260._8_4_ = uVar37;
                    local_1260._12_4_ = uVar37;
                    local_1260._16_4_ = uVar37;
                    local_1260._20_4_ = uVar37;
                    local_1260._24_4_ = uVar37;
                    local_1260._28_4_ = uVar37;
                    local_1320[0] = (RTCHitN)(char)uVar48;
                    local_1320[1] = (RTCHitN)(char)((uint)uVar48 >> 8);
                    local_1320[2] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                    local_1320[3] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                    local_1320[4] = (RTCHitN)(char)uVar48;
                    local_1320[5] = (RTCHitN)(char)((uint)uVar48 >> 8);
                    local_1320[6] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                    local_1320[7] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                    local_1320[8] = (RTCHitN)(char)uVar48;
                    local_1320[9] = (RTCHitN)(char)((uint)uVar48 >> 8);
                    local_1320[10] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                    local_1320[0xb] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                    local_1320[0xc] = (RTCHitN)(char)uVar48;
                    local_1320[0xd] = (RTCHitN)(char)((uint)uVar48 >> 8);
                    local_1320[0xe] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                    local_1320[0xf] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                    local_1320[0x10] = (RTCHitN)(char)uVar48;
                    local_1320[0x11] = (RTCHitN)(char)((uint)uVar48 >> 8);
                    local_1320[0x12] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                    local_1320[0x13] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                    local_1320[0x14] = (RTCHitN)(char)uVar48;
                    local_1320[0x15] = (RTCHitN)(char)((uint)uVar48 >> 8);
                    local_1320[0x16] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                    local_1320[0x17] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                    local_1320[0x18] = (RTCHitN)(char)uVar48;
                    local_1320[0x19] = (RTCHitN)(char)((uint)uVar48 >> 8);
                    local_1320[0x1a] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                    local_1320[0x1b] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                    local_1320[0x1c] = (RTCHitN)(char)uVar48;
                    local_1320[0x1d] = (RTCHitN)(char)((uint)uVar48 >> 8);
                    local_1320[0x1e] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                    local_1320[0x1f] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                    uStack_12bc = local_12c0;
                    uStack_12b8 = local_12c0;
                    uStack_12b4 = local_12c0;
                    uStack_12b0 = local_12c0;
                    uStack_12ac = local_12c0;
                    uStack_12a8 = local_12c0;
                    uStack_12a4 = local_12c0;
                    auVar58 = vpcmpeqd_avx2(local_1260,local_1260);
                    uStack_123c = (local_1610.context)->instID[0];
                    local_1240 = uStack_123c;
                    uStack_1238 = uStack_123c;
                    uStack_1234 = uStack_123c;
                    uStack_1230 = uStack_123c;
                    uStack_122c = uStack_123c;
                    uStack_1228 = uStack_123c;
                    uStack_1224 = uStack_123c;
                    uStack_121c = (local_1610.context)->instPrimID[0];
                    local_1220 = uStack_121c;
                    uStack_1218 = uStack_121c;
                    uStack_1214 = uStack_121c;
                    uStack_1210 = uStack_121c;
                    uStack_120c = uStack_121c;
                    uStack_1208 = uStack_121c;
                    uStack_1204 = uStack_121c;
                    local_15e0 = local_14a0._0_8_;
                    uStack_15d8 = local_14a0._8_8_;
                    uStack_15d0 = local_14a0._16_8_;
                    uStack_15c8 = local_14a0._24_8_;
                    local_1610.valid = (int *)&local_15e0;
                    local_1610.geometryUserPtr = *(void **)(lVar39 + 0x18);
                    local_1610.hit = local_1320;
                    local_1610.N = 8;
                    local_1610.ray = (RTCRayN *)ray;
                    if (*(code **)(lVar39 + 0x48) != (code *)0x0) {
                      local_16e0._0_8_ = ray;
                      local_1640._0_8_ = k;
                      local_1680._0_8_ = puVar43;
                      local_1690._0_8_ = uVar44;
                      local_16a0._0_8_ = uVar45;
                      local_16b0._0_4_ = uVar89;
                      auVar58 = ZEXT1632(auVar58._0_16_);
                      (**(code **)(lVar39 + 0x48))(&local_1610);
                      auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
                      k = local_1640._0_8_;
                      puVar43 = (ulong *)local_1680._0_8_;
                      ray = (RayK<8> *)local_16e0._0_8_;
                      uVar44 = local_1690._0_8_;
                      uVar45 = local_16a0._0_8_;
                      uVar89 = local_16b0._0_4_;
                    }
                    auVar29._8_8_ = uStack_15d8;
                    auVar29._0_8_ = local_15e0;
                    auVar29._16_8_ = uStack_15d0;
                    auVar29._24_8_ = uStack_15c8;
                    auVar15 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar29);
                    auVar16 = auVar58 & ~auVar15;
                    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar16 >> 0x7f,0) == '\0') &&
                          (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar16 >> 0xbf,0) == '\0') &&
                        (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar16[0x1f]) {
                      auVar15 = auVar15 ^ auVar58;
                      uVar40 = local_16c0._0_8_;
                    }
                    else {
                      p_Var2 = context->args->filter;
                      if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar39 + 0x3e) & 0x40) != 0)
                          ))) {
                        local_16e0._0_8_ = ray;
                        local_1680._0_8_ = puVar43;
                        local_1690._0_8_ = uVar44;
                        local_16a0._0_8_ = uVar45;
                        local_16b0._0_4_ = uVar89;
                        auVar58 = ZEXT1632(auVar58._0_16_);
                        (*p_Var2)(&local_1610);
                        auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
                        puVar43 = (ulong *)local_1680._0_8_;
                        ray = (RayK<8> *)local_16e0._0_8_;
                        uVar44 = local_1690._0_8_;
                        uVar45 = local_16a0._0_8_;
                        uVar89 = local_16b0._0_4_;
                      }
                      auVar30._8_8_ = uStack_15d8;
                      auVar30._0_8_ = local_15e0;
                      auVar30._16_8_ = uStack_15d0;
                      auVar30._24_8_ = uStack_15c8;
                      auVar16 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar30);
                      auVar15 = auVar16 ^ auVar58;
                      auVar68._8_4_ = 0xff800000;
                      auVar68._0_8_ = 0xff800000ff800000;
                      auVar68._12_4_ = 0xff800000;
                      auVar68._16_4_ = 0xff800000;
                      auVar68._20_4_ = 0xff800000;
                      auVar68._24_4_ = 0xff800000;
                      auVar68._28_4_ = 0xff800000;
                      auVar58 = vblendvps_avx(auVar68,*(undefined1 (*) [32])(local_1610.ray + 0x100)
                                              ,auVar16);
                      *(undefined1 (*) [32])(local_1610.ray + 0x100) = auVar58;
                      uVar40 = local_16c0._0_8_;
                    }
                    bVar27 = (auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar28 = (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar26 = (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar25 = SUB321(auVar15 >> 0x7f,0) == '\0';
                    bVar24 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar23 = SUB321(auVar15 >> 0xbf,0) == '\0';
                    bVar22 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar21 = -1 < auVar15[0x1f];
                    bVar51 = ((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) &&
                             bVar22) && bVar21;
                    if (((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) &&
                        bVar22) && bVar21) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar89;
                      uVar47 = uVar47 ^ 1L << (uVar46 & 0x3f);
                    }
                  }
                  if (!bVar51) {
                    uVar37 = 0;
                    uVar46 = local_1650;
                    uVar47 = local_1658;
                    uVar49 = local_1648;
                    if (bVar50) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      uVar37 = 1;
                    }
                    goto LAB_006b37ec;
                  }
                } while (uVar47 != 0);
                uVar47 = 0;
              }
            }
          }
          local_1628 = local_1628 + 1;
          bVar50 = local_1628 < local_1620;
        } while (local_1628 != local_1620);
        uVar37 = 0;
        uVar46 = local_1650;
        uVar47 = local_1658;
        uVar49 = local_1648;
      }
    }
LAB_006b37ec:
  } while ((uVar37 & 3) == 0);
  return local_1618 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }